

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *self,unsigned_long *numFrames,int *xrunOccurred)

{
  bool bVar1;
  ulong local_58;
  int local_4c;
  unsigned_long uStack_48;
  int xrun;
  unsigned_long commonFrames;
  unsigned_long playbackFrames;
  unsigned_long captureFrames;
  int *piStack_28;
  PaError result;
  int *xrunOccurred_local;
  unsigned_long *numFrames_local;
  PaAlsaStream *self_local;
  
  captureFrames._4_4_ = 0;
  playbackFrames = 0xffffffffffffffff;
  commonFrames = 0xffffffffffffffff;
  uStack_48 = 0;
  local_4c = 0;
  if (*xrunOccurred != 0) {
    *numFrames = 0;
    return 0;
  }
  bVar1 = true;
  if ((self->capture).ready == 0) {
    bVar1 = (self->playback).ready != 0;
  }
  piStack_28 = xrunOccurred;
  xrunOccurred_local = (int *)numFrames;
  numFrames_local = (unsigned_long *)self;
  if (bVar1) {
    if (((self->capture).pcm != (snd_pcm_t *)0x0) && ((self->capture).ready != 0)) {
      playbackFrames = *numFrames;
      paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                             (&self->capture,&self->bufferProcessor,&playbackFrames,&local_4c);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4093\n"
                         );
        captureFrames._4_4_ = paUtilErr_;
        goto LAB_0011ca1d;
      }
    }
    if ((numFrames_local[0x68] != 0) && ((int)numFrames_local[0x6c] != 0)) {
      commonFrames = *(unsigned_long *)xrunOccurred_local;
      paUtilErr_ = PaAlsaStreamComponent_RegisterChannels
                             ((PaAlsaStreamComponent *)(numFrames_local + 0x61),
                              (PaUtilBufferProcessor *)(numFrames_local + 0xd),&commonFrames,
                              &local_4c);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4099\n"
                         );
        captureFrames._4_4_ = paUtilErr_;
        goto LAB_0011ca1d;
      }
    }
    if (local_4c == 0) {
      if (playbackFrames < commonFrames) {
        local_58 = playbackFrames;
      }
      else {
        local_58 = commonFrames;
      }
      uStack_48 = local_58;
      if (*(ulong *)xrunOccurred_local < local_58) {
        uStack_48 = 0;
      }
      else {
        if (numFrames_local[0x58] != 0) {
          if ((int)numFrames_local[0x5c] == 0) {
            PaUtil_SetNoInput((PaUtilBufferProcessor *)(numFrames_local + 0xd));
          }
          else {
            PaUtil_SetInputFrameCount((PaUtilBufferProcessor *)(numFrames_local + 0xd),local_58);
          }
        }
        if (numFrames_local[0x68] != 0) {
          if ((int)numFrames_local[0x6c] == 0) {
            if ((int)numFrames_local[0x4e] == 0) {
              __assert_fail("self->neverDropInput",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0x103a,
                            "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            if (numFrames_local[0x58] == 0) {
              __assert_fail("self->capture.pcm != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                            ,0x103b,
                            "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)"
                           );
            }
            PaUtil_SetNoOutput((PaUtilBufferProcessor *)(numFrames_local + 0xd));
          }
          else {
            PaUtil_SetOutputFrameCount((PaUtilBufferProcessor *)(numFrames_local + 0xd),uStack_48);
          }
        }
      }
    }
    else if (uStack_48 != 0) {
      __assert_fail("0 == commonFrames",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x1008,
                    "PaError PaAlsaStream_SetUpBuffers(PaAlsaStream *, unsigned long *, int *)");
    }
    *(unsigned_long *)xrunOccurred_local = uStack_48;
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'self->capture.ready || self->playback.ready\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4084\n"
                     );
    captureFrames._4_4_ = -0x2702;
  }
LAB_0011ca1d:
  do {
    if (local_4c == 0) {
LAB_0011ca6d:
      *piStack_28 = local_4c;
      return captureFrames._4_4_;
    }
    paUtilErr_ = PaAlsaStream_HandleXrun((PaAlsaStream *)numFrames_local);
    if (-1 < paUtilErr_) {
      xrunOccurred_local[0] = 0;
      xrunOccurred_local[1] = 0;
      goto LAB_0011ca6d;
    }
    PaUtil_DebugPrint(
                     "Expression \'PaAlsaStream_HandleXrun( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4166\n"
                     );
    captureFrames._4_4_ = paUtilErr_;
  } while( true );
}

Assistant:

static PaError PaAlsaStream_SetUpBuffers( PaAlsaStream* self, unsigned long* numFrames, int* xrunOccurred )
{
    PaError result = paNoError;
    unsigned long captureFrames = ULONG_MAX, playbackFrames = ULONG_MAX, commonFrames = 0;
    int xrun = 0;

    if( *xrunOccurred )
    {
        *numFrames = 0;
        return result;
    }
    /* If we got here at least one of the pcm's should be marked ready */
    PA_UNLESS( self->capture.ready || self->playback.ready, paInternalError );

    /* Extract per-channel ALSA buffer pointers and register them with the buffer processor.
     * It is possible that a direction is not marked ready however, because it is out of sync with the other.
     */
    if( self->capture.pcm && self->capture.ready )
    {
        captureFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->capture, &self->bufferProcessor, &captureFrames,
                    &xrun ) );
    }
    if( self->playback.pcm && self->playback.ready )
    {
        playbackFrames = *numFrames;
        PA_ENSURE( PaAlsaStreamComponent_RegisterChannels( &self->playback, &self->bufferProcessor, &playbackFrames,
                    &xrun ) );
    }
    if( xrun )
    {
        /* Nothing more to do */
        assert( 0 == commonFrames );
        goto end;
    }

    commonFrames = PA_MIN( captureFrames, playbackFrames );
    /* assert( commonFrames <= *numFrames ); */
    if( commonFrames > *numFrames )
    {
        /* Hmmm ... how come there are more frames available than we requested!? Blah. */
        PA_DEBUG(( "%s: Common available frames are reported to be more than number requested: %lu, %lu, callbackMode: %d\n", __FUNCTION__,
                    commonFrames, *numFrames, self->callbackMode ));
        if( self->capture.pcm )
        {
            PA_DEBUG(( "%s: captureFrames: %lu, capture.ready: %d\n", __FUNCTION__, captureFrames, self->capture.ready ));
        }
        if( self->playback.pcm )
        {
            PA_DEBUG(( "%s: playbackFrames: %lu, playback.ready: %d\n", __FUNCTION__, playbackFrames, self->playback.ready ));
        }

        commonFrames = 0;
        goto end;
    }

    /* Inform PortAudio of the number of frames we got.
     * @concern FullDuplex We might be experiencing underflow in either end; if its an input underflow, we go on
     * with output. If its output underflow however, depending on the paNeverDropInput flag, we may want to simply
     * discard the excess input or call the callback with paOutputOverflow flagged.
     */
    if( self->capture.pcm )
    {
        if( self->capture.ready )
        {
            PaUtil_SetInputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have input underflow */
            PaUtil_SetNoInput( &self->bufferProcessor );
        }
    }
    if( self->playback.pcm )
    {
        if( self->playback.ready )
        {
            PaUtil_SetOutputFrameCount( &self->bufferProcessor, commonFrames );
        }
        else
        {
            /* We have output underflow, but keeping input data (paNeverDropInput) */
            assert( self->neverDropInput );
            assert( self->capture.pcm != NULL );
            PA_DEBUG(( "%s: Setting output buffers to NULL\n", __FUNCTION__ ));
            PaUtil_SetNoOutput( &self->bufferProcessor );
        }
    }

end:
    *numFrames = commonFrames;
error:
    if( xrun )
    {
        PA_ENSURE( PaAlsaStream_HandleXrun( self ) );
        *numFrames = 0;
    }
    *xrunOccurred = xrun;

    return result;
}